

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_model.hpp
# Opt level: O2

bool __thiscall
BaseModel::detectChessboardCorners
          (BaseModel *this,Mat *image,Size *board_size,
          vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *image_points,
          bool draw_corners)

{
  char cVar1;
  int iVar2;
  undefined7 in_register_00000081;
  Size local_140;
  _InputArray local_138;
  Size local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined1 local_108 [16];
  uchar *local_f8;
  undefined4 local_a8 [2];
  Mat *local_a0;
  undefined8 local_98;
  Mat gray;
  
  iVar2 = (int)CONCAT71(in_register_00000081,draw_corners);
  gray.data = (uchar *)0x0;
  gray.flags = 0x1010000;
  local_120 = *board_size;
  local_f8 = (uchar *)0x0;
  local_108._0_4_ = -0x7dfcfff3;
  local_108._8_8_ = image_points;
  gray._8_8_ = image;
  cVar1 = cv::findChessboardCorners(&gray);
  if (cVar1 != '\0') {
    cv::Mat::Mat(&gray);
    local_f8 = (uchar *)0x0;
    local_138.sz.width = 0;
    local_138.sz.height = 0;
    local_108._0_4_ = 0x1010000;
    local_138.flags = 0x2010000;
    local_138.obj = &gray;
    local_108._8_8_ = image;
    cv::cvtColor((cv *)local_108,&local_138,(_OutputArray *)0x6,0,iVar2);
    local_f8 = (uchar *)0x0;
    local_108._0_4_ = 0x1010000;
    local_138.sz.width = 0;
    local_138.sz.height = 0;
    local_138.flags = -0x7cfcfff3;
    local_110 = 0xb0000000b;
    local_118 = 0xffffffffffffffff;
    local_138.obj = image_points;
    local_108._8_8_ = &gray;
    cv::cornerSubPix(0x3fb999999999999a);
    if (draw_corners) {
      local_138.sz.width = 0;
      local_138.sz.height = 0;
      local_138.flags = 0x3010000;
      local_140 = *board_size;
      local_138.obj = image;
      cv::Mat::Mat<cv::Point_<float>>((Mat *)local_108,image_points,false);
      local_98 = 0;
      local_a8[0] = 0x1010000;
      local_a0 = (Mat *)local_108;
      cv::drawChessboardCorners(&local_138,&local_140,local_a8,1);
      cv::Mat::~Mat((Mat *)local_108);
    }
    cv::Mat::~Mat(&gray);
  }
  return (bool)cVar1;
}

Assistant:

bool detectChessboardCorners(
    cv::Mat& image,
    const cv::Size& board_size,
    std::vector<cv::Point2f>& image_points,
    bool draw_corners=true
  ) {
    bool found = cv::findChessboardCorners(
      image,
      board_size,
      image_points,
      cv::CALIB_CB_ADAPTIVE_THRESH | cv::CALIB_CB_NORMALIZE_IMAGE
    );

    if (found) {
      cv::Mat gray;
      cv::cvtColor(image, gray, cv::COLOR_BGR2GRAY);
    
      cv::cornerSubPix(
	gray,
	image_points,
	cv::Size(11,11),
	cv::Size(-1,-1),
	cv::TermCriteria(cv::TermCriteria::EPS + cv::TermCriteria::COUNT, 30, 0.1)
      );
      
      // image_list_detected.push_back(image_list[i]);
      // object_points_list.push_back(object_points);
      // image_points_list.push_back(image_points);
      
      if (draw_corners)
	cv::drawChessboardCorners(image, board_size, cv::Mat(image_points), found);
    }
    
    return found;
  }